

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeFpConstant(Builder *this,Id type,double d,bool specConstant)

{
  bool bVar1;
  int iVar2;
  int width;
  bool specConstant_local;
  double d_local;
  Id type_local;
  Builder *this_local;
  
  iVar2 = getScalarTypeWidth(this,type);
  bVar1 = isFloatType(this,type);
  if (!bVar1) {
    __assert_fail("isFloatType(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x70a,"Id spv::Builder::makeFpConstant(Id, double, bool)");
  }
  if (iVar2 == 0x10) {
    this_local._4_4_ = makeFloat16Constant(this,(float)d,specConstant);
  }
  else if (iVar2 == 0x20) {
    this_local._4_4_ = makeFloatConstant(this,(float)d,specConstant);
  }
  else {
    if (iVar2 != 0x40) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x717,"Id spv::Builder::makeFpConstant(Id, double, bool)");
    }
    this_local._4_4_ = makeDoubleConstant(this,d,specConstant);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::makeFpConstant(Id type, double d, bool specConstant)
{
    const int width = getScalarTypeWidth(type);

    assert(isFloatType(type));

    switch (width) {
    case 16:
            return makeFloat16Constant((float)d, specConstant);
    case 32:
            return makeFloatConstant((float)d, specConstant);
    case 64:
            return makeDoubleConstant(d, specConstant);
    default:
            break;
    }

    assert(false);
    return NoResult;
}